

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

void __thiscall
duckdb::Vector::ToUnifiedFormat(Vector *this,idx_t count,UnifiedVectorFormat *format)

{
  SelectionVector *pSVar1;
  Vector *vector;
  VectorChildBuffer *pVVar2;
  TemplatedValidityMask<unsigned_long> *pTVar3;
  buffer_ptr<duckdb::VectorChildBuffer> new_aux;
  Vector child_vector;
  undefined1 auStack_a8 [16];
  Vector local_98;
  
  if (this->vector_type == CONSTANT_VECTOR) {
    pSVar1 = ConstantVector::ZeroSelectionVector(count,&format->owned_sel);
    format->sel = pSVar1;
    format->data = this->data;
  }
  else {
    if (this->vector_type == DICTIONARY_VECTOR) {
      pSVar1 = DictionaryVector::SelVector(this);
      SelectionVector::Initialize(&format->owned_sel,pSVar1);
      format->sel = &format->owned_sel;
      vector = DictionaryVector::Child(this);
      if (vector->vector_type != FLAT_VECTOR) {
        Vector(&local_98,vector);
        Flatten(&local_98,pSVar1,count);
        make_shared_ptr<duckdb::VectorChildBuffer,duckdb::Vector>((Vector *)auStack_a8);
        pVVar2 = shared_ptr<duckdb::VectorChildBuffer,_true>::operator->
                           ((shared_ptr<duckdb::VectorChildBuffer,_true> *)auStack_a8);
        format->data = (pVVar2->data).data;
        pVVar2 = shared_ptr<duckdb::VectorChildBuffer,_true>::operator->
                           ((shared_ptr<duckdb::VectorChildBuffer,_true> *)auStack_a8);
        FlatVector::VerifyFlatVector(&pVVar2->data);
        TemplatedValidityMask<unsigned_long>::operator=
                  (&(format->validity).super_TemplatedValidityMask<unsigned_long>,
                   &(pVVar2->data).validity.super_TemplatedValidityMask<unsigned_long>);
        shared_ptr<duckdb::VectorBuffer,_true>::operator=<duckdb::VectorChildBuffer,_0>
                  (&this->auxiliary,(shared_ptr<duckdb::VectorChildBuffer,_true> *)auStack_a8);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_a8 + 8));
        ~Vector(&local_98);
        return;
      }
      format->data = vector->data;
      FlatVector::VerifyFlatVector(vector);
      pTVar3 = &(vector->validity).super_TemplatedValidityMask<unsigned_long>;
      goto LAB_012a7787;
    }
    Flatten(this,count);
    FlatVector::IncrementalSelectionVector();
    format->sel = &FlatVector::IncrementalSelectionVector::INCREMENTAL_SELECTION_VECTOR;
    format->data = this->data;
    FlatVector::VerifyFlatVector(this);
  }
  pTVar3 = &(this->validity).super_TemplatedValidityMask<unsigned_long>;
LAB_012a7787:
  TemplatedValidityMask<unsigned_long>::operator=
            (&(format->validity).super_TemplatedValidityMask<unsigned_long>,pTVar3);
  return;
}

Assistant:

void Vector::ToUnifiedFormat(idx_t count, UnifiedVectorFormat &format) {
	switch (GetVectorType()) {
	case VectorType::DICTIONARY_VECTOR: {
		auto &sel = DictionaryVector::SelVector(*this);
		format.owned_sel.Initialize(sel);
		format.sel = &format.owned_sel;

		auto &child = DictionaryVector::Child(*this);
		if (child.GetVectorType() == VectorType::FLAT_VECTOR) {
			format.data = FlatVector::GetData(child);
			format.validity = FlatVector::Validity(child);
		} else {
			// dictionary with non-flat child: create a new reference to the child and flatten it
			Vector child_vector(child);
			child_vector.Flatten(sel, count);
			auto new_aux = make_buffer<VectorChildBuffer>(std::move(child_vector));

			format.data = FlatVector::GetData(new_aux->data);
			format.validity = FlatVector::Validity(new_aux->data);
			this->auxiliary = std::move(new_aux);
		}
		break;
	}
	case VectorType::CONSTANT_VECTOR:
		format.sel = ConstantVector::ZeroSelectionVector(count, format.owned_sel);
		format.data = ConstantVector::GetData(*this);
		format.validity = ConstantVector::Validity(*this);
		break;
	default:
		Flatten(count);
		format.sel = FlatVector::IncrementalSelectionVector();
		format.data = FlatVector::GetData(*this);
		format.validity = FlatVector::Validity(*this);
		break;
	}
}